

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O1

bool __thiscall Clasp::SatElite::doPreprocess(SatElite *this)

{
  uint32 uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  time_t tVar5;
  long lVar6;
  uint32 clauseId;
  Event local_30 [2];
  SatElite *local_28;
  undefined8 local_20;
  
  uVar1 = (this->super_SatPreprocessor).clauses_.ebo_.size;
  if (uVar1 != 0) {
    clauseId = 0;
    do {
      attach(this,clauseId,true);
      clauseId = clauseId + 1;
    } while (uVar1 != clauseId);
  }
  if (((ulong)*(this->super_SatPreprocessor).opts_ & 0x1ffe000) == 0) {
    lVar6 = 0x7fffffffffffffff;
  }
  else {
    tVar5 = time((time_t *)0x0);
    lVar6 = (ulong)(*(uint *)(this->super_SatPreprocessor).opts_ >> 0xd & 0xfff) + tVar5;
  }
  this->timeout_ = lVar6;
  uVar4 = *(uint *)(this->super_SatPreprocessor).opts_ >> 2 & 0x7ff;
  bVar2 = true;
  if ((ulong)(this->elimHeap_).heap_.ebo_.size + (ulong)(this->queue_).ebo_.size != 0) {
    uVar4 = -(uint)(uVar4 == 0) | uVar4;
    while (bVar3 = backwardSubsume(this), bVar3) {
      tVar5 = time((time_t *)0x0);
      bVar3 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if ((this->timeout_ < tVar5) || (bVar3)) goto LAB_001912da;
      bVar3 = eliminateVars(this);
      if (!bVar3) break;
      if ((ulong)(this->elimHeap_).heap_.ebo_.size + (ulong)(this->queue_).ebo_.size == 0)
      goto LAB_001912da;
    }
    bVar2 = false;
  }
LAB_001912da:
  if (bVar2) {
    local_20 = 0x6400000064;
    local_30[0] = (Event)(((uint)local_30[0] & 0xf0000000) +
                          (Event_t<Clasp::SatElite::Progress>::id_s & 0xffff) * 0x1000 + 0x2aa);
    local_28 = this;
    SharedContext::report((this->super_SatPreprocessor).ctx_,local_30);
  }
  return bVar2;
}

Assistant:

bool SatElite::doPreprocess() {
	// 1. add clauses to occur lists
	for (uint32 i  = 0, end = numClauses(); i != end; ++i) {
		attach(i, true);
	}
	// 2. remove subsumed clauses, eliminate vars by clause distribution
	timeout_ = opts_->limTime ? time(0) + opts_->limTime : std::numeric_limits<std::time_t>::max();
	for (uint32 i = 0, end = opts_->limIters ? opts_->limIters : UINT32_MAX; queue_.size()+elimHeap_.size() > 0; ++i) {
		if (!backwardSubsume())   { return false; }
		if (timeout() || i == end){ break;        }
		if (!eliminateVars())     { return false; }
	}
	reportProgress(Progress::event_algorithm, 100,100);
	return true;
}